

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int vcf_write_line(htsFile *fp,kstring_t *line)

{
  BGZF *fp_00;
  char *pcVar1;
  ulong __n;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t __size;
  
  sVar3 = line->l;
  pcVar1 = line->s;
  if (pcVar1[sVar3 - 1] != '\n') {
    uVar2 = sVar3 + 1;
    if (line->m <= uVar2) {
      uVar2 = uVar2 >> 1 | uVar2;
      uVar2 = uVar2 >> 2 | uVar2;
      uVar2 = uVar2 >> 4 | uVar2;
      uVar2 = uVar2 >> 8 | uVar2;
      __size = (uVar2 >> 0x10 | uVar2) + 1;
      line->m = __size;
      pcVar1 = (char *)realloc(pcVar1,__size);
      if (pcVar1 == (char *)0x0) goto LAB_0011d66b;
      line->s = pcVar1;
      sVar3 = line->l;
      uVar2 = sVar3 + 1;
    }
    line->l = uVar2;
    pcVar1[sVar3] = '\n';
    line->s[line->l] = '\0';
  }
LAB_0011d66b:
  fp_00 = (BGZF *)(fp->fp).hfile;
  uVar2 = line->l;
  pcVar1 = line->s;
  if ((fp->format).compression == no_compression) {
    uVar4 = fp_00->uncompressed_address - (long)*(void **)&fp_00->block_length;
    __n = uVar2;
    if (uVar4 < uVar2) {
      __n = uVar4;
    }
    memcpy(*(void **)&fp_00->block_length,pcVar1,__n);
    *(ulong *)&fp_00->block_length = *(long *)&fp_00->block_length + __n;
    if (uVar4 < uVar2) {
      __n = hwrite2((hFILE *)fp_00,pcVar1,uVar2,__n);
    }
  }
  else {
    __n = bgzf_write(fp_00,pcVar1,uVar2);
  }
  return -(uint)((long)(int)__n != line->l);
}

Assistant:

int vcf_write_line(htsFile *fp, kstring_t *line)
{
    int ret;
    if ( line->s[line->l-1]!='\n' ) kputc('\n',line);
    if ( fp->format.compression!=no_compression )
        ret = bgzf_write(fp->fp.bgzf, line->s, line->l);
    else
        ret = hwrite(fp->fp.hfile, line->s, line->l);
    return ret==line->l ? 0 : -1;
}